

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O0

void __thiscall irr::gui::IGUIElement::move(IGUIElement *this,vector2d<int> absoluteMovement)

{
  undefined1 in_stack_ffffffffffffffe0 [16];
  
  core::rect<int>::operator+(in_stack_ffffffffffffffe0._8_8_,in_stack_ffffffffffffffe0._0_8_);
  setRelativePosition((IGUIElement *)absoluteMovement,(rect<int> *)this);
  return;
}

Assistant:

virtual void move(core::position2d<s32> absoluteMovement)
	{
		setRelativePosition(DesiredRect + absoluteMovement);
	}